

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_graph.cc
# Opt level: O3

bool __thiscall InputGraph::adjacent(InputGraph *this,int a,int b)

{
  _Head_base<0UL,_InputGraph::Imp_*,_false> _Var1;
  const_iterator cVar2;
  key_type local_10;
  
  _Var1._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>._M_t.
       super__Tuple_impl<0UL,_InputGraph::Imp_*,_std::default_delete<InputGraph::Imp>_>.
       super__Head_base<0UL,_InputGraph::Imp_*,_false>._M_head_impl;
  local_10.first = a;
  local_10.second = b;
  cVar2 = std::
          _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&((_Var1._M_head_impl)->edges)._M_t,&local_10);
  return cVar2._M_node != (_Base_ptr)((long)&(_Var1._M_head_impl)->edges + 8U);
}

Assistant:

auto InputGraph::has_vertex_labels() const -> bool
{
    return _imp->has_vertex_labels;
}